

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O3

void LZWCleanup(TIFF *tif)

{
  uint8_t *p;
  
  TIFFPredictorCleanup(tif);
  p = tif->tif_data;
  if (p != (uint8_t *)0x0) {
    if (*(void **)(p + 0xe8) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0xe8));
      p = tif->tif_data;
    }
    if (*(void **)(p + 0x120) != (void *)0x0) {
      _TIFFfreeExt(tif,*(void **)(p + 0x120));
      p = tif->tif_data;
    }
    _TIFFfreeExt(tif,p);
    tif->tif_data = (uint8_t *)0x0;
    _TIFFSetDefaultCompressionState(tif);
    return;
  }
  __assert_fail("tif->tif_data != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                ,0x566,"void LZWCleanup(TIFF *)");
}

Assistant:

static void LZWCleanup(TIFF *tif)
{
    (void)TIFFPredictorCleanup(tif);

    assert(tif->tif_data != 0);

    if (DecoderState(tif)->dec_codetab)
        _TIFFfreeExt(tif, DecoderState(tif)->dec_codetab);

    if (EncoderState(tif)->enc_hashtab)
        _TIFFfreeExt(tif, EncoderState(tif)->enc_hashtab);

    _TIFFfreeExt(tif, tif->tif_data);
    tif->tif_data = NULL;

    _TIFFSetDefaultCompressionState(tif);
}